

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<ProString>::growAppend
          (QCommonArrayOps<ProString> *this,ProString *b,ProString *e)

{
  ProString *pPVar1;
  ProString **data;
  QArrayDataPointer<ProString> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> local_38;
  ProString *local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (ProString *)0x0;
    local_38.size = 0;
    pPVar1 = (this->super_Type).super_QGenericArrayOps<ProString>.super_QArrayDataPointer<ProString>
             .ptr;
    if ((b < pPVar1) ||
       (pPVar1 + (this->super_Type).super_QGenericArrayOps<ProString>.
                 super_QArrayDataPointer<ProString>.size <= b)) {
      data = (ProString **)0x0;
      old = (QArrayDataPointer<ProString> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<ProString>::detachAndGrow
              ((QArrayDataPointer<ProString> *)this,GrowsAtEnd,
               ((long)e - (long)b >> 4) * -0x5555555555555555,data,old);
    QGenericArrayOps<ProString>::copyAppend
              ((QGenericArrayOps<ProString> *)this,local_20,
               (ProString *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }